

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx::forward_inplace(BinaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int op_type;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *ptr;
  long lVar6;
  float local_34;
  
  op_type = (this->super_BinaryOp).op_type;
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    iVar2 = bottom_top_blob->h;
    iVar3 = bottom_top_blob->w;
    iVar4 = bottom_top_blob->d;
    iVar5 = bottom_top_blob->elempack;
    lVar6 = 0;
    do {
      ptr = (float *)(bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
      binary_op_vector(ptr,&local_34,ptr,iVar2 * iVar3 * iVar4 * iVar5,1,1,1,op_type);
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    binary_op_scalar_inplace(bottom_top_blob, b, op_type, opt);

    return 0;
}